

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O3

void __thiscall
icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int32_t iVar1;
  UChar32 *pUVar2;
  UChar32 *pUVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  UChar32 UVar7;
  UChar32 UVar8;
  long lVar9;
  UErrorCode status;
  undefined8 uStack_28;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    uStack_28 = 0;
    ensureBufferCapacity(this,otherLen + this->len,(UErrorCode *)((long)&uStack_28 + 4));
    if (uStack_28._4_4_ < 1) {
      pUVar2 = this->list;
      pUVar3 = this->buffer;
      UVar7 = *pUVar2;
      UVar8 = *other;
      iVar4 = 0;
      iVar5 = 1;
      iVar6 = 1;
switchD_002c15c4_default:
      switch(polarity) {
      case '\0':
        if (UVar7 < UVar8) {
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          UVar7 = pUVar2[lVar9];
          polarity = '\x01';
          goto switchD_002c15c4_default;
        }
        if (UVar8 < UVar7) {
LAB_002c16e1:
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = other[lVar9];
          polarity = '\x02';
          goto switchD_002c15c4_default;
        }
        if (UVar7 == 0x110000) {
LAB_002c16f3:
          pUVar3[iVar4] = 0x110000;
          this->len = iVar4 + 1;
          this->list = pUVar3;
          this->buffer = pUVar2;
          iVar1 = this->capacity;
          this->capacity = this->bufferCapacity;
          this->bufferCapacity = iVar1;
          if (this->pat == (char16_t *)0x0) {
            return;
          }
          uprv_free_63(this->pat);
          this->pat = (char16_t *)0x0;
          this->patLen = 0;
          return;
        }
        pUVar3[iVar4] = UVar7;
        lVar9 = (long)iVar5;
        iVar5 = iVar5 + 1;
        UVar7 = pUVar2[lVar9];
        break;
      case '\x01':
        if (UVar7 < UVar8) {
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          UVar7 = pUVar2[lVar9];
          polarity = '\0';
          goto switchD_002c15c4_default;
        }
        if (UVar7 <= UVar8) {
          if (UVar7 != 0x110000) {
            lVar9 = (long)iVar5;
            iVar5 = iVar5 + 1;
            UVar7 = pUVar2[lVar9];
            goto LAB_002c16e1;
          }
          goto LAB_002c16f3;
        }
        pUVar3[iVar4] = UVar8;
        break;
      case '\x02':
        if (UVar8 < UVar7) {
LAB_002c16be:
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = other[lVar9];
          polarity = '\0';
        }
        else if (UVar7 < UVar8) {
          lVar9 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pUVar3[lVar9] = UVar7;
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          UVar7 = pUVar2[lVar9];
          polarity = '\x03';
        }
        else {
          if (UVar7 == 0x110000) goto LAB_002c16f3;
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          UVar7 = pUVar2[lVar9];
LAB_002c1691:
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = other[lVar9];
          polarity = '\x01';
        }
        goto switchD_002c15c4_default;
      case '\x03':
        if (UVar7 < UVar8) goto code_r0x002c1605;
        if (UVar8 < UVar7) {
          lVar9 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pUVar3[lVar9] = UVar8;
          goto LAB_002c1691;
        }
        if (UVar7 != 0x110000) {
          lVar9 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pUVar3[lVar9] = UVar7;
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          UVar7 = pUVar2[lVar9];
          goto LAB_002c16be;
        }
        goto LAB_002c16f3;
      default:
        goto switchD_002c15c4_default;
      }
      iVar4 = iVar4 + 1;
      lVar9 = (long)iVar6;
      iVar6 = iVar6 + 1;
      UVar8 = other[lVar9];
      polarity = '\x03';
      goto switchD_002c15c4_default;
    }
  }
  return;
code_r0x002c1605:
  lVar9 = (long)iVar4;
  iVar4 = iVar4 + 1;
  pUVar3[lVar9] = UVar7;
  lVar9 = (long)iVar5;
  iVar5 = iVar5 + 1;
  UVar7 = pUVar2[lVar9];
  polarity = '\x02';
  goto switchD_002c15c4_default;
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}